

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  byte bVar4;
  uchar uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint y_00;
  int iVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  stbi_uc *psVar17;
  uint uVar18;
  uint x_00;
  ulong uVar19;
  uint uVar20;
  uchar *puVar21;
  byte *pbVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  
  iVar6 = stbi__get16be(s);
  uVar7 = stbi__get16be(s);
  if ((uVar7 | iVar6 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (stbi_uc *)0x0;
  }
  iVar6 = stbi__get16be(s);
  if (iVar6 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (stbi_uc *)0x0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar14 = s->img_buffer;
  }
  else {
    psVar14 = s->img_buffer;
    iVar6 = (int)s->img_buffer_end - (int)psVar14;
    if (iVar6 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar6);
      goto LAB_0010ff11;
    }
  }
  s->img_buffer = psVar14 + 6;
LAB_0010ff11:
  uVar7 = stbi__get16be(s);
  if (uVar7 < 0x11) {
    iVar6 = stbi__get16be(s);
    uVar8 = stbi__get16be(s);
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    iVar11 = stbi__get16be(s);
    if (iVar11 == 8) {
      iVar11 = stbi__get16be(s);
      if (iVar11 == 3) {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        uVar12 = stbi__get16be(s);
        if (uVar12 < 2) {
          uVar18 = iVar6 * 0x10000;
          y_00 = uVar8 + uVar18;
          uVar20 = iVar9 * 0x10000;
          x_00 = uVar10 + uVar20;
          iVar6 = y_00 * x_00;
          psVar14 = (stbi_uc *)malloc((long)(iVar6 * 4));
          if (psVar14 == (uchar *)0x0) {
            stbi__g_failure_reason = "outofmem";
          }
          else {
            uVar16 = (ulong)((uVar8 | uVar18) * (uVar10 | uVar20));
            if (uVar12 == 0) {
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              lVar23 = uVar16 - 1;
              auVar86._8_4_ = (int)lVar23;
              auVar86._0_8_ = lVar23;
              auVar86._12_4_ = (int)((ulong)lVar23 >> 0x20);
              uVar8 = (uVar8 + uVar18) * (uVar10 + uVar20);
              uVar16 = 0;
              puVar21 = psVar14;
              auVar24 = _DAT_0011c2c0;
              auVar25 = _DAT_0011c2d0;
              auVar29 = _DAT_0011c2e0;
              auVar34 = _DAT_0011c2f0;
              auVar35 = _DAT_0011c300;
              auVar56 = _DAT_0011c310;
              auVar76 = _DAT_0011c320;
              auVar78 = _DAT_0011c330;
              do {
                if (uVar7 < uVar16) {
                  if (0 < iVar6) {
                    uVar5 = -(uVar16 == 3);
                    uVar19 = 0;
                    do {
                      auVar27._8_4_ = (int)uVar19;
                      auVar27._0_8_ = uVar19;
                      auVar27._12_4_ = (int)(uVar19 >> 0x20);
                      auVar31 = auVar86 ^ _DAT_0011c010;
                      auVar45 = (auVar27 | auVar78) ^ _DAT_0011c010;
                      iVar9 = auVar31._0_4_;
                      iVar70 = -(uint)(iVar9 < auVar45._0_4_);
                      iVar11 = auVar31._4_4_;
                      auVar46._4_4_ = -(uint)(iVar11 < auVar45._4_4_);
                      iVar13 = auVar31._8_4_;
                      iVar75 = -(uint)(iVar13 < auVar45._8_4_);
                      iVar33 = auVar31._12_4_;
                      auVar46._12_4_ = -(uint)(iVar33 < auVar45._12_4_);
                      auVar63._4_4_ = iVar70;
                      auVar63._0_4_ = iVar70;
                      auVar63._8_4_ = iVar75;
                      auVar63._12_4_ = iVar75;
                      auVar77 = pshuflw(in_XMM5,auVar63,0xe8);
                      auVar31._4_4_ = -(uint)(auVar45._4_4_ == iVar11);
                      auVar31._12_4_ = -(uint)(auVar45._12_4_ == iVar33);
                      auVar31._0_4_ = auVar31._4_4_;
                      auVar31._8_4_ = auVar31._12_4_;
                      auVar82 = pshuflw(in_XMM6,auVar31,0xe8);
                      auVar46._0_4_ = auVar46._4_4_;
                      auVar46._8_4_ = auVar46._12_4_;
                      auVar45 = pshuflw(auVar77,auVar46,0xe8);
                      auVar83._8_4_ = 0xffffffff;
                      auVar83._0_8_ = 0xffffffffffffffff;
                      auVar83._12_4_ = 0xffffffff;
                      auVar45 = (auVar45 | auVar82 & auVar77) ^ auVar83;
                      auVar45 = packssdw(auVar45,auVar45);
                      if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4] = uVar5;
                      }
                      auVar46 = auVar31 & auVar63 | auVar46;
                      auVar31 = packssdw(auVar46,auVar46);
                      auVar31 = packssdw(auVar31 ^ auVar83,auVar31 ^ auVar83);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31._0_4_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 4] = uVar5;
                      }
                      auVar31 = (auVar27 | auVar76) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar31._0_4_);
                      auVar82._4_4_ = -(uint)(iVar11 < auVar31._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar31._8_4_);
                      auVar82._12_4_ = -(uint)(iVar33 < auVar31._12_4_);
                      auVar45._4_4_ = iVar70;
                      auVar45._0_4_ = iVar70;
                      auVar45._8_4_ = iVar75;
                      auVar45._12_4_ = iVar75;
                      auVar77._4_4_ = -(uint)(auVar31._4_4_ == iVar11);
                      auVar77._12_4_ = -(uint)(auVar31._12_4_ == iVar33);
                      auVar77._0_4_ = auVar77._4_4_;
                      auVar77._8_4_ = auVar77._12_4_;
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      auVar31 = auVar77 & auVar45 | auVar82;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packssdw(auVar31 ^ auVar83,auVar31 ^ auVar83);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
                        puVar21[uVar19 * 4 + 8] = uVar5;
                      }
                      auVar45 = pshufhw(auVar45,auVar45,0x84);
                      auVar63 = pshufhw(auVar77,auVar77,0x84);
                      auVar46 = pshufhw(auVar45,auVar82,0x84);
                      auVar45 = (auVar46 | auVar63 & auVar45) ^ auVar83;
                      auVar45 = packssdw(auVar45,auVar45);
                      auVar45 = packsswb(auVar45,auVar45);
                      if ((auVar45._0_4_ >> 0x18 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0xc] = uVar5;
                      }
                      auVar45 = (auVar27 | auVar56) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar45._0_4_);
                      auVar48._4_4_ = -(uint)(iVar11 < auVar45._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar45._8_4_);
                      auVar48._12_4_ = -(uint)(iVar33 < auVar45._12_4_);
                      auVar64._4_4_ = iVar70;
                      auVar64._0_4_ = iVar70;
                      auVar64._8_4_ = iVar75;
                      auVar64._12_4_ = iVar75;
                      auVar31 = pshuflw(auVar31,auVar64,0xe8);
                      auVar47._4_4_ = -(uint)(auVar45._4_4_ == iVar11);
                      auVar47._12_4_ = -(uint)(auVar45._12_4_ == iVar33);
                      auVar47._0_4_ = auVar47._4_4_;
                      auVar47._8_4_ = auVar47._12_4_;
                      auVar46 = pshuflw(auVar83,auVar47,0xe8);
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar45 = pshuflw(auVar31,auVar48,0xe8);
                      auVar84._8_4_ = 0xffffffff;
                      auVar84._0_8_ = 0xffffffffffffffff;
                      auVar84._12_4_ = 0xffffffff;
                      auVar31 = (auVar45 | auVar46 & auVar31) ^ auVar84;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x10] = uVar5;
                      }
                      auVar48 = auVar47 & auVar64 | auVar48;
                      auVar31 = packssdw(auVar48,auVar48);
                      auVar31 = packssdw(auVar31 ^ auVar84,auVar31 ^ auVar84);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31._4_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x14] = uVar5;
                      }
                      auVar31 = (auVar27 | auVar35) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar31._0_4_);
                      auVar73._4_4_ = -(uint)(iVar11 < auVar31._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar31._8_4_);
                      auVar73._12_4_ = -(uint)(iVar33 < auVar31._12_4_);
                      auVar49._4_4_ = iVar70;
                      auVar49._0_4_ = iVar70;
                      auVar49._8_4_ = iVar75;
                      auVar49._12_4_ = iVar75;
                      auVar65._4_4_ = -(uint)(auVar31._4_4_ == iVar11);
                      auVar65._12_4_ = -(uint)(auVar31._12_4_ == iVar33);
                      auVar65._0_4_ = auVar65._4_4_;
                      auVar65._8_4_ = auVar65._12_4_;
                      auVar73._0_4_ = auVar73._4_4_;
                      auVar73._8_4_ = auVar73._12_4_;
                      auVar31 = auVar65 & auVar49 | auVar73;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packssdw(auVar31 ^ auVar84,auVar31 ^ auVar84);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x18] = uVar5;
                      }
                      auVar45 = pshufhw(auVar49,auVar49,0x84);
                      auVar63 = pshufhw(auVar65,auVar65,0x84);
                      auVar46 = pshufhw(auVar45,auVar73,0x84);
                      auVar45 = (auVar46 | auVar63 & auVar45) ^ auVar84;
                      auVar45 = packssdw(auVar45,auVar45);
                      auVar45 = packsswb(auVar45,auVar45);
                      if ((auVar45._6_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x1c] = uVar5;
                      }
                      auVar45 = (auVar27 | auVar34) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar45._0_4_);
                      auVar51._4_4_ = -(uint)(iVar11 < auVar45._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar45._8_4_);
                      auVar51._12_4_ = -(uint)(iVar33 < auVar45._12_4_);
                      auVar66._4_4_ = iVar70;
                      auVar66._0_4_ = iVar70;
                      auVar66._8_4_ = iVar75;
                      auVar66._12_4_ = iVar75;
                      auVar31 = pshuflw(auVar31,auVar66,0xe8);
                      auVar50._4_4_ = -(uint)(auVar45._4_4_ == iVar11);
                      auVar50._12_4_ = -(uint)(auVar45._12_4_ == iVar33);
                      auVar50._0_4_ = auVar50._4_4_;
                      auVar50._8_4_ = auVar50._12_4_;
                      auVar46 = pshuflw(auVar84,auVar50,0xe8);
                      auVar51._0_4_ = auVar51._4_4_;
                      auVar51._8_4_ = auVar51._12_4_;
                      auVar45 = pshuflw(auVar31,auVar51,0xe8);
                      auVar85._8_4_ = 0xffffffff;
                      auVar85._0_8_ = 0xffffffffffffffff;
                      auVar85._12_4_ = 0xffffffff;
                      auVar31 = (auVar45 | auVar46 & auVar31) ^ auVar85;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x20] = uVar5;
                      }
                      auVar51 = auVar50 & auVar66 | auVar51;
                      auVar31 = packssdw(auVar51,auVar51);
                      auVar31 = packssdw(auVar31 ^ auVar85,auVar31 ^ auVar85);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31._8_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x24] = uVar5;
                      }
                      auVar31 = (auVar27 | auVar29) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar31._0_4_);
                      auVar74._4_4_ = -(uint)(iVar11 < auVar31._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar31._8_4_);
                      auVar74._12_4_ = -(uint)(iVar33 < auVar31._12_4_);
                      auVar52._4_4_ = iVar70;
                      auVar52._0_4_ = iVar70;
                      auVar52._8_4_ = iVar75;
                      auVar52._12_4_ = iVar75;
                      auVar67._4_4_ = -(uint)(auVar31._4_4_ == iVar11);
                      auVar67._12_4_ = -(uint)(auVar31._12_4_ == iVar33);
                      auVar67._0_4_ = auVar67._4_4_;
                      auVar67._8_4_ = auVar67._12_4_;
                      auVar74._0_4_ = auVar74._4_4_;
                      auVar74._8_4_ = auVar74._12_4_;
                      auVar31 = auVar67 & auVar52 | auVar74;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packssdw(auVar31 ^ auVar85,auVar31 ^ auVar85);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x28] = uVar5;
                      }
                      auVar45 = pshufhw(auVar52,auVar52,0x84);
                      auVar63 = pshufhw(auVar67,auVar67,0x84);
                      auVar46 = pshufhw(auVar45,auVar74,0x84);
                      auVar45 = (auVar46 | auVar63 & auVar45) ^ auVar85;
                      auVar45 = packssdw(auVar45,auVar45);
                      auVar45 = packsswb(auVar45,auVar45);
                      if ((auVar45._10_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x2c] = uVar5;
                      }
                      auVar45 = (auVar27 | auVar25) ^ _DAT_0011c010;
                      iVar70 = -(uint)(iVar9 < auVar45._0_4_);
                      auVar54._4_4_ = -(uint)(iVar11 < auVar45._4_4_);
                      iVar75 = -(uint)(iVar13 < auVar45._8_4_);
                      auVar54._12_4_ = -(uint)(iVar33 < auVar45._12_4_);
                      auVar68._4_4_ = iVar70;
                      auVar68._0_4_ = iVar70;
                      auVar68._8_4_ = iVar75;
                      auVar68._12_4_ = iVar75;
                      auVar31 = pshuflw(auVar31,auVar68,0xe8);
                      auVar53._4_4_ = -(uint)(auVar45._4_4_ == iVar11);
                      auVar53._12_4_ = -(uint)(auVar45._12_4_ == iVar33);
                      auVar53._0_4_ = auVar53._4_4_;
                      auVar53._8_4_ = auVar53._12_4_;
                      auVar46 = pshuflw(auVar85,auVar53,0xe8);
                      auVar54._0_4_ = auVar54._4_4_;
                      auVar54._8_4_ = auVar54._12_4_;
                      auVar45 = pshuflw(auVar31,auVar54,0xe8);
                      in_XMM6._8_4_ = 0xffffffff;
                      in_XMM6._0_8_ = 0xffffffffffffffff;
                      in_XMM6._12_4_ = 0xffffffff;
                      auVar31 = (auVar45 | auVar46 & auVar31) ^ in_XMM6;
                      auVar31 = packssdw(auVar31,auVar31);
                      in_XMM5 = packsswb(auVar31,auVar31);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x30] = uVar5;
                      }
                      auVar54 = auVar53 & auVar68 | auVar54;
                      auVar31 = packssdw(auVar54,auVar54);
                      auVar31 = packssdw(auVar31 ^ in_XMM6,auVar31 ^ in_XMM6);
                      auVar31 = packsswb(auVar31,auVar31);
                      if ((auVar31._12_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x34] = uVar5;
                      }
                      auVar27 = (auVar27 | auVar24) ^ _DAT_0011c010;
                      auVar69._0_4_ = -(uint)(iVar9 < auVar27._0_4_);
                      auVar69._4_4_ = -(uint)(iVar11 < auVar27._4_4_);
                      auVar69._8_4_ = -(uint)(iVar13 < auVar27._8_4_);
                      auVar69._12_4_ = -(uint)(iVar33 < auVar27._12_4_);
                      auVar55._4_4_ = auVar69._0_4_;
                      auVar55._0_4_ = auVar69._0_4_;
                      auVar55._8_4_ = auVar69._8_4_;
                      auVar55._12_4_ = auVar69._8_4_;
                      auVar28._4_4_ = -(uint)(auVar27._4_4_ == iVar11);
                      auVar28._12_4_ = -(uint)(auVar27._12_4_ == iVar33);
                      auVar28._0_4_ = auVar28._4_4_;
                      auVar28._8_4_ = auVar28._12_4_;
                      auVar32._4_4_ = auVar69._4_4_;
                      auVar32._0_4_ = auVar69._4_4_;
                      auVar32._8_4_ = auVar69._12_4_;
                      auVar32._12_4_ = auVar69._12_4_;
                      auVar27 = packssdw(auVar69,auVar28 & auVar55 | auVar32);
                      auVar27 = packssdw(auVar27 ^ in_XMM6,auVar27 ^ in_XMM6);
                      auVar27 = packsswb(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        puVar21[uVar19 * 4 + 0x38] = uVar5;
                      }
                      auVar45 = pshufhw(auVar55,auVar55,0x84);
                      auVar27 = pshufhw(auVar28,auVar28,0x84);
                      auVar31 = pshufhw(auVar32,auVar32,0x84);
                      auVar27 = packssdw(auVar27 & auVar45,(auVar31 | auVar27 & auVar45) ^ in_XMM6);
                      auVar27 = packsswb(auVar27,auVar27);
                      if ((auVar27._14_2_ >> 8 & 1) != 0) {
                        puVar21[uVar19 * 4 + 0x3c] = uVar5;
                      }
                      uVar19 = uVar19 + 0x10;
                    } while (((ulong)uVar8 + 0xf & 0xfffffffffffffff0) != uVar19);
                  }
                }
                else if (0 < iVar6) {
                  psVar15 = s->img_buffer;
                  psVar17 = s->img_buffer_end;
                  lVar23 = 0;
                  do {
                    if (psVar15 < psVar17) {
                      s->img_buffer = psVar15 + 1;
                      uVar5 = *psVar15;
                      psVar15 = psVar15 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      uVar5 = '\0';
                    }
                    else {
                      iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar9 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        uVar5 = '\0';
                        psVar17 = psVar2;
                      }
                      else {
                        uVar5 = *psVar1;
                        psVar17 = psVar1 + iVar9;
                      }
                      auVar78 = _DAT_0011c330;
                      auVar76 = _DAT_0011c320;
                      auVar56 = _DAT_0011c310;
                      auVar35 = _DAT_0011c300;
                      auVar34 = _DAT_0011c2f0;
                      auVar29 = _DAT_0011c2e0;
                      auVar25 = _DAT_0011c2d0;
                      auVar24 = _DAT_0011c2c0;
                      s->img_buffer_end = psVar17;
                      s->img_buffer = psVar2;
                      psVar15 = psVar2;
                    }
                    puVar21[lVar23 * 4] = uVar5;
                    lVar23 = lVar23 + 1;
                  } while (uVar8 != (uint)lVar23);
                }
                uVar16 = uVar16 + 1;
                puVar21 = puVar21 + 1;
              } while (uVar16 != 4);
            }
            else {
              stbi__skip(s,uVar7 * y_00 * 2);
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              lVar23 = uVar16 - 1;
              auVar24._8_4_ = (int)lVar23;
              auVar24._0_8_ = lVar23;
              auVar24._12_4_ = (int)((ulong)lVar23 >> 0x20);
              puVar21 = psVar14 + 0x3c;
              uVar16 = 0;
              do {
                if (uVar16 < uVar7) {
                  if (0 < iVar6) {
                    pbVar22 = psVar14 + uVar16;
                    iVar9 = 0;
                    do {
                      pbVar3 = s->img_buffer;
                      psVar15 = s->img_buffer_end;
                      if (pbVar3 < psVar15) {
                        s->img_buffer = pbVar3 + 1;
                        bVar4 = *pbVar3;
                        psVar17 = pbVar3 + 1;
LAB_001101c3:
                        if (bVar4 != 0x80) {
                          uVar12 = (uint)bVar4;
                          if (-1 < (char)bVar4) goto LAB_001101dd;
                          if (psVar17 < psVar15) {
                            s->img_buffer = psVar17 + 1;
                            bVar4 = *psVar17;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar4 = 0;
                          }
                          else {
                            iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar11 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar4 = 0;
                              psVar15 = psVar2;
                            }
                            else {
                              bVar4 = *psVar1;
                              psVar15 = psVar1 + iVar11;
                            }
                            s->img_buffer_end = psVar15;
                            s->img_buffer = psVar2;
                          }
                          iVar11 = uVar12 - 0x101;
                          do {
                            *pbVar22 = bVar4;
                            pbVar22 = pbVar22 + 4;
                            iVar11 = iVar11 + 1;
                          } while (iVar11 != 0);
                          iVar9 = iVar9 + (0x101 - uVar12);
                        }
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar4 = 0;
                            psVar15 = psVar2;
                          }
                          else {
                            bVar4 = *psVar1;
                            psVar15 = psVar1 + iVar11;
                          }
                          s->img_buffer_end = psVar15;
                          s->img_buffer = psVar2;
                          psVar17 = psVar2;
                          goto LAB_001101c3;
                        }
                        uVar12 = 0;
LAB_001101dd:
                        iVar11 = uVar12 + 1;
                        do {
                          pbVar3 = s->img_buffer;
                          if (pbVar3 < s->img_buffer_end) {
                            s->img_buffer = pbVar3 + 1;
                            bVar4 = *pbVar3;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar4 = 0;
                          }
                          else {
                            iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar13 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar4 = 0;
                              psVar15 = psVar2;
                            }
                            else {
                              bVar4 = *psVar1;
                              psVar15 = psVar1 + iVar13;
                            }
                            s->img_buffer_end = psVar15;
                            s->img_buffer = psVar2;
                          }
                          *pbVar22 = bVar4;
                          pbVar22 = pbVar22 + 4;
                          iVar11 = iVar11 + -1;
                        } while (iVar11 != 0);
                        iVar9 = iVar9 + uVar12 + 1;
                      }
                    } while (iVar9 < iVar6);
                  }
                }
                else if (0 < iVar6) {
                  uVar5 = -(uVar16 == 3);
                  uVar19 = 0;
                  do {
                    auVar25._8_4_ = (int)uVar19;
                    auVar25._0_8_ = uVar19;
                    auVar25._12_4_ = (int)(uVar19 >> 0x20);
                    auVar29 = auVar24 ^ _DAT_0011c010;
                    auVar34 = (auVar25 | _DAT_0011c330) ^ _DAT_0011c010;
                    iVar9 = auVar29._0_4_;
                    iVar70 = -(uint)(iVar9 < auVar34._0_4_);
                    iVar11 = auVar29._4_4_;
                    auVar35._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
                    iVar13 = auVar29._8_4_;
                    iVar75 = -(uint)(iVar13 < auVar34._8_4_);
                    iVar33 = auVar29._12_4_;
                    auVar35._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                    auVar56._4_4_ = iVar70;
                    auVar56._0_4_ = iVar70;
                    auVar56._8_4_ = iVar75;
                    auVar56._12_4_ = iVar75;
                    auVar76 = pshuflw(in_XMM5,auVar56,0xe8);
                    auVar29._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
                    auVar29._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                    auVar29._0_4_ = auVar29._4_4_;
                    auVar29._8_4_ = auVar29._12_4_;
                    auVar78 = pshuflw(in_XMM6,auVar29,0xe8);
                    auVar35._0_4_ = auVar35._4_4_;
                    auVar35._8_4_ = auVar35._12_4_;
                    auVar34 = pshuflw(auVar76,auVar35,0xe8);
                    auVar79._8_4_ = 0xffffffff;
                    auVar79._0_8_ = 0xffffffffffffffff;
                    auVar79._12_4_ = 0xffffffff;
                    auVar34 = (auVar34 | auVar78 & auVar76) ^ auVar79;
                    auVar34 = packssdw(auVar34,auVar34);
                    if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0x3c] = uVar5;
                    }
                    auVar35 = auVar29 & auVar56 | auVar35;
                    auVar29 = packssdw(auVar35,auVar35);
                    auVar29 = packssdw(auVar29 ^ auVar79,auVar29 ^ auVar79);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29._0_4_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x38] = uVar5;
                    }
                    auVar29 = (auVar25 | _DAT_0011c320) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar29._0_4_);
                    auVar78._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar29._8_4_);
                    auVar78._12_4_ = -(uint)(iVar33 < auVar29._12_4_);
                    auVar34._4_4_ = iVar70;
                    auVar34._0_4_ = iVar70;
                    auVar34._8_4_ = iVar75;
                    auVar34._12_4_ = iVar75;
                    auVar76._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                    auVar76._12_4_ = -(uint)(auVar29._12_4_ == iVar33);
                    auVar76._0_4_ = auVar76._4_4_;
                    auVar76._8_4_ = auVar76._12_4_;
                    auVar78._0_4_ = auVar78._4_4_;
                    auVar78._8_4_ = auVar78._12_4_;
                    auVar29 = auVar76 & auVar34 | auVar78;
                    auVar29 = packssdw(auVar29,auVar29);
                    auVar29 = packssdw(auVar29 ^ auVar79,auVar29 ^ auVar79);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x34] = uVar5;
                    }
                    auVar34 = pshufhw(auVar34,auVar34,0x84);
                    auVar56 = pshufhw(auVar76,auVar76,0x84);
                    auVar35 = pshufhw(auVar34,auVar78,0x84);
                    auVar34 = (auVar35 | auVar56 & auVar34) ^ auVar79;
                    auVar34 = packssdw(auVar34,auVar34);
                    auVar34 = packsswb(auVar34,auVar34);
                    if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x30] = uVar5;
                    }
                    auVar34 = (auVar25 | _DAT_0011c310) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar34._0_4_);
                    auVar37._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar34._8_4_);
                    auVar37._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                    auVar57._4_4_ = iVar70;
                    auVar57._0_4_ = iVar70;
                    auVar57._8_4_ = iVar75;
                    auVar57._12_4_ = iVar75;
                    auVar29 = pshuflw(auVar29,auVar57,0xe8);
                    auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
                    auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                    auVar36._0_4_ = auVar36._4_4_;
                    auVar36._8_4_ = auVar36._12_4_;
                    auVar35 = pshuflw(auVar79,auVar36,0xe8);
                    auVar37._0_4_ = auVar37._4_4_;
                    auVar37._8_4_ = auVar37._12_4_;
                    auVar34 = pshuflw(auVar29,auVar37,0xe8);
                    auVar80._8_4_ = 0xffffffff;
                    auVar80._0_8_ = 0xffffffffffffffff;
                    auVar80._12_4_ = 0xffffffff;
                    auVar29 = (auVar34 | auVar35 & auVar29) ^ auVar80;
                    auVar29 = packssdw(auVar29,auVar29);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0x2c] = uVar5;
                    }
                    auVar37 = auVar36 & auVar57 | auVar37;
                    auVar29 = packssdw(auVar37,auVar37);
                    auVar29 = packssdw(auVar29 ^ auVar80,auVar29 ^ auVar80);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29._4_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x28] = uVar5;
                    }
                    auVar29 = (auVar25 | _DAT_0011c300) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar29._0_4_);
                    auVar71._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar29._8_4_);
                    auVar71._12_4_ = -(uint)(iVar33 < auVar29._12_4_);
                    auVar38._4_4_ = iVar70;
                    auVar38._0_4_ = iVar70;
                    auVar38._8_4_ = iVar75;
                    auVar38._12_4_ = iVar75;
                    auVar58._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                    auVar58._12_4_ = -(uint)(auVar29._12_4_ == iVar33);
                    auVar58._0_4_ = auVar58._4_4_;
                    auVar58._8_4_ = auVar58._12_4_;
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar29 = auVar58 & auVar38 | auVar71;
                    auVar29 = packssdw(auVar29,auVar29);
                    auVar29 = packssdw(auVar29 ^ auVar80,auVar29 ^ auVar80);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0x24] = uVar5;
                    }
                    auVar34 = pshufhw(auVar38,auVar38,0x84);
                    auVar56 = pshufhw(auVar58,auVar58,0x84);
                    auVar35 = pshufhw(auVar34,auVar71,0x84);
                    auVar34 = (auVar35 | auVar56 & auVar34) ^ auVar80;
                    auVar34 = packssdw(auVar34,auVar34);
                    auVar34 = packsswb(auVar34,auVar34);
                    if ((auVar34._6_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x20] = uVar5;
                    }
                    auVar34 = (auVar25 | _DAT_0011c2f0) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar34._0_4_);
                    auVar40._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar34._8_4_);
                    auVar40._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                    auVar59._4_4_ = iVar70;
                    auVar59._0_4_ = iVar70;
                    auVar59._8_4_ = iVar75;
                    auVar59._12_4_ = iVar75;
                    auVar29 = pshuflw(auVar29,auVar59,0xe8);
                    auVar39._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
                    auVar39._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                    auVar39._0_4_ = auVar39._4_4_;
                    auVar39._8_4_ = auVar39._12_4_;
                    auVar35 = pshuflw(auVar80,auVar39,0xe8);
                    auVar40._0_4_ = auVar40._4_4_;
                    auVar40._8_4_ = auVar40._12_4_;
                    auVar34 = pshuflw(auVar29,auVar40,0xe8);
                    auVar81._8_4_ = 0xffffffff;
                    auVar81._0_8_ = 0xffffffffffffffff;
                    auVar81._12_4_ = 0xffffffff;
                    auVar29 = (auVar34 | auVar35 & auVar29) ^ auVar81;
                    auVar29 = packssdw(auVar29,auVar29);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0x1c] = uVar5;
                    }
                    auVar40 = auVar39 & auVar59 | auVar40;
                    auVar29 = packssdw(auVar40,auVar40);
                    auVar29 = packssdw(auVar29 ^ auVar81,auVar29 ^ auVar81);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29._8_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x18] = uVar5;
                    }
                    auVar29 = (auVar25 | _DAT_0011c2e0) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar29._0_4_);
                    auVar72._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar29._8_4_);
                    auVar72._12_4_ = -(uint)(iVar33 < auVar29._12_4_);
                    auVar41._4_4_ = iVar70;
                    auVar41._0_4_ = iVar70;
                    auVar41._8_4_ = iVar75;
                    auVar41._12_4_ = iVar75;
                    auVar60._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                    auVar60._12_4_ = -(uint)(auVar29._12_4_ == iVar33);
                    auVar60._0_4_ = auVar60._4_4_;
                    auVar60._8_4_ = auVar60._12_4_;
                    auVar72._0_4_ = auVar72._4_4_;
                    auVar72._8_4_ = auVar72._12_4_;
                    auVar29 = auVar60 & auVar41 | auVar72;
                    auVar29 = packssdw(auVar29,auVar29);
                    auVar29 = packssdw(auVar29 ^ auVar81,auVar29 ^ auVar81);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0x14] = uVar5;
                    }
                    auVar34 = pshufhw(auVar41,auVar41,0x84);
                    auVar56 = pshufhw(auVar60,auVar60,0x84);
                    auVar35 = pshufhw(auVar34,auVar72,0x84);
                    auVar34 = (auVar35 | auVar56 & auVar34) ^ auVar81;
                    auVar34 = packssdw(auVar34,auVar34);
                    auVar34 = packsswb(auVar34,auVar34);
                    if ((auVar34._10_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -0x10] = uVar5;
                    }
                    auVar34 = (auVar25 | _DAT_0011c2d0) ^ _DAT_0011c010;
                    iVar70 = -(uint)(iVar9 < auVar34._0_4_);
                    auVar43._4_4_ = -(uint)(iVar11 < auVar34._4_4_);
                    iVar75 = -(uint)(iVar13 < auVar34._8_4_);
                    auVar43._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                    auVar61._4_4_ = iVar70;
                    auVar61._0_4_ = iVar70;
                    auVar61._8_4_ = iVar75;
                    auVar61._12_4_ = iVar75;
                    auVar29 = pshuflw(auVar29,auVar61,0xe8);
                    auVar42._4_4_ = -(uint)(auVar34._4_4_ == iVar11);
                    auVar42._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                    auVar42._0_4_ = auVar42._4_4_;
                    auVar42._8_4_ = auVar42._12_4_;
                    auVar35 = pshuflw(auVar81,auVar42,0xe8);
                    auVar43._0_4_ = auVar43._4_4_;
                    auVar43._8_4_ = auVar43._12_4_;
                    auVar34 = pshuflw(auVar29,auVar43,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar29 = (auVar34 | auVar35 & auVar29) ^ in_XMM6;
                    auVar29 = packssdw(auVar29,auVar29);
                    in_XMM5 = packsswb(auVar29,auVar29);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -0xc] = uVar5;
                    }
                    auVar43 = auVar42 & auVar61 | auVar43;
                    auVar29 = packssdw(auVar43,auVar43);
                    auVar29 = packssdw(auVar29 ^ in_XMM6,auVar29 ^ in_XMM6);
                    auVar29 = packsswb(auVar29,auVar29);
                    if ((auVar29._12_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4 + -8] = uVar5;
                    }
                    auVar25 = (auVar25 | _DAT_0011c2c0) ^ _DAT_0011c010;
                    auVar62._0_4_ = -(uint)(iVar9 < auVar25._0_4_);
                    auVar62._4_4_ = -(uint)(iVar11 < auVar25._4_4_);
                    auVar62._8_4_ = -(uint)(iVar13 < auVar25._8_4_);
                    auVar62._12_4_ = -(uint)(iVar33 < auVar25._12_4_);
                    auVar44._4_4_ = auVar62._0_4_;
                    auVar44._0_4_ = auVar62._0_4_;
                    auVar44._8_4_ = auVar62._8_4_;
                    auVar44._12_4_ = auVar62._8_4_;
                    auVar26._4_4_ = -(uint)(auVar25._4_4_ == iVar11);
                    auVar26._12_4_ = -(uint)(auVar25._12_4_ == iVar33);
                    auVar26._0_4_ = auVar26._4_4_;
                    auVar26._8_4_ = auVar26._12_4_;
                    auVar30._4_4_ = auVar62._4_4_;
                    auVar30._0_4_ = auVar62._4_4_;
                    auVar30._8_4_ = auVar62._12_4_;
                    auVar30._12_4_ = auVar62._12_4_;
                    auVar25 = packssdw(auVar62,auVar26 & auVar44 | auVar30);
                    auVar25 = packssdw(auVar25 ^ in_XMM6,auVar25 ^ in_XMM6);
                    auVar25 = packsswb(auVar25,auVar25);
                    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar21[uVar19 * 4 + -4] = uVar5;
                    }
                    auVar34 = pshufhw(auVar44,auVar44,0x84);
                    auVar25 = pshufhw(auVar26,auVar26,0x84);
                    auVar29 = pshufhw(auVar30,auVar30,0x84);
                    auVar25 = packssdw(auVar25 & auVar34,(auVar29 | auVar25 & auVar34) ^ in_XMM6);
                    auVar25 = packsswb(auVar25,auVar25);
                    if ((auVar25._14_2_ >> 8 & 1) != 0) {
                      puVar21[uVar19 * 4] = uVar5;
                    }
                    uVar19 = uVar19 + 0x10;
                  } while (((ulong)((uVar8 + uVar18) * (uVar10 + uVar20)) + 0xf & 0xfffffffffffffff0
                           ) != uVar19);
                }
                uVar16 = uVar16 + 1;
                puVar21 = puVar21 + 1;
              } while (uVar16 != 4);
            }
            if (((req_comp & 0xfffffffbU) == 0) ||
               (psVar14 = stbi__convert_format(psVar14,4,req_comp,x_00,y_00),
               psVar14 != (uchar *)0x0)) {
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return psVar14;
            }
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   if (stbi__get16be(s) != 8)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel > channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = channel == 3 ? 255 : 0;
         } else {
            // Read the data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = stbi__get8(s);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}